

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O2

int mg_session_read_time(mg_session *session,mg_time **time)

{
  int iVar1;
  mg_time *val;
  
  iVar1 = mg_session_check_struct_header(session,0xb2,'T');
  if (iVar1 == 0) {
    val = mg_time_alloc(session->decoder_allocator);
    if (val == (mg_time *)0x0) {
      mg_session_set_error(session,"out of memory");
      iVar1 = -3;
    }
    else {
      iVar1 = mg_session_read_integer(session,&val->nanoseconds);
      if ((iVar1 == 0) &&
         (iVar1 = mg_session_read_integer(session,&val->tz_offset_seconds), iVar1 == 0)) {
        *time = val;
        return 0;
      }
      mg_allocator_free(session->decoder_allocator,val);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_time(mg_session *session, mg_time **time) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 2), MG_SIGNATURE_TIME));
  mg_time *time_tmp = mg_time_alloc(session->decoder_allocator);
  if (!time_tmp) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;
  status = mg_session_read_integer(session, &time_tmp->nanoseconds);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &time_tmp->tz_offset_seconds);
  if (status != 0) {
    goto cleanup;
  }

  *time = time_tmp;
  return 0;

cleanup:
  mg_allocator_free(session->decoder_allocator, time_tmp);
  return status;
}